

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O2

int __thiscall libtorrent::bdecode_node::list_size(bdecode_node *this)

{
  int iVar1;
  int iVar2;
  
  if (this->m_size != -1) {
    return this->m_size;
  }
  iVar1 = this->m_last_index;
  if (iVar1 == -1) {
    iVar2 = this->m_token_idx + 1;
    iVar1 = 0;
  }
  else {
    iVar2 = this->m_last_token;
  }
  while ((SUB84(this->m_root_tokens[iVar2],0) & 0xe0000000) != 0xa0000000) {
    iVar2 = (SUB84(this->m_root_tokens[iVar2],4) & 0x1fffffff) + iVar2;
    iVar1 = iVar1 + 1;
  }
  this->m_size = iVar1;
  return iVar1;
}

Assistant:

int bdecode_node::list_size() const
	{
		TORRENT_ASSERT(type() == list_t);

		if (m_size != -1) return m_size;

		// make sure this is a list.
		bdecode_token const* tokens = m_root_tokens;
		TORRENT_ASSERT(tokens[m_token_idx].type == bdecode_token::list);

		// this is the first item
		int token = m_token_idx + 1;
		int ret = 0;

		// do we have a lookup cached?
		if (m_last_index != -1)
		{
			token = m_last_token;
			ret = m_last_index;
		}
		while (tokens[token].type != bdecode_token::end)
		{
			token += tokens[token].next_item;
			++ret;
		}

		m_size = ret;

		return ret;
	}